

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2rect.cc
# Opt level: O0

R2Rect * R2Rect::FromCenterSize(R2Rect *__return_storage_ptr__,R2Point *center,R2Point *size)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  R1Interval local_38;
  R1Interval local_28;
  Vector2<double> *local_18;
  R2Point *size_local;
  R2Point *center_local;
  
  local_18 = size;
  size_local = center;
  dVar1 = Vector2<double>::x(center);
  dVar2 = Vector2<double>::x(local_18);
  dVar3 = Vector2<double>::x(size_local);
  dVar4 = Vector2<double>::x(local_18);
  R1Interval::R1Interval(&local_28,dVar1 - dVar2 * 0.5,dVar3 + dVar4 * 0.5);
  dVar1 = Vector2<double>::y(size_local);
  dVar2 = Vector2<double>::y(local_18);
  dVar3 = Vector2<double>::y(size_local);
  dVar4 = Vector2<double>::y(local_18);
  R1Interval::R1Interval(&local_38,dVar1 - dVar2 * 0.5,dVar3 + dVar4 * 0.5);
  R2Rect(__return_storage_ptr__,&local_28,&local_38);
  return __return_storage_ptr__;
}

Assistant:

R2Rect R2Rect::FromCenterSize(const R2Point& center, const R2Point& size) {
  return R2Rect(R1Interval(center.x() - 0.5 * size.x(),
                           center.x() + 0.5 * size.x()),
                R1Interval(center.y() - 0.5 * size.y(),
                           center.y() + 0.5 * size.y()));
}